

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<char> * __thiscall
cs::allocator_type<cs_impl::any::holder<char>,_64UL,_cs_impl::default_allocator_provider>::
alloc<char>(allocator_type<cs_impl::any::holder<char>,_64UL,_cs_impl::default_allocator_provider>
            *this,char *args)

{
  size_t sVar1;
  holder<char> *phVar2;
  
  if ((this->mOffset == 0) || (global_thread_counter != 0)) {
    phVar2 = (holder<char> *)operator_new(0x10);
  }
  else {
    sVar1 = this->mOffset;
    this->mOffset = sVar1 - 1;
    phVar2 = this->mPool[sVar1 - 1];
  }
  (phVar2->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__baseHolder_0023b690;
  phVar2->mDat = *args;
  return phVar2;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}